

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ar.c
# Opt level: O0

int archive_write_set_format_ar_bsd(archive *_a)

{
  int iVar1;
  long in_RDI;
  int magic_test;
  int r;
  archive_write *a;
  char *in_stack_00000078;
  uint in_stack_00000080;
  uint in_stack_00000084;
  archive *in_stack_00000088;
  archive_write *in_stack_ffffffffffffffd8;
  int local_4;
  
  iVar1 = __archive_check_magic
                    (in_stack_00000088,in_stack_00000084,in_stack_00000080,in_stack_00000078);
  if (iVar1 == -0x1e) {
    local_4 = -0x1e;
  }
  else {
    local_4 = archive_write_set_format_ar(in_stack_ffffffffffffffd8);
    if (local_4 == 0) {
      *(undefined4 *)(in_RDI + 0x10) = 0x70002;
      *(char **)(in_RDI + 0x18) = "ar (BSD)";
    }
  }
  return local_4;
}

Assistant:

int
archive_write_set_format_ar_bsd(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	int r;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_set_format_ar_bsd");
	r = archive_write_set_format_ar(a);
	if (r == ARCHIVE_OK) {
		a->archive.archive_format = ARCHIVE_FORMAT_AR_BSD;
		a->archive.archive_format_name = "ar (BSD)";
	}
	return (r);
}